

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::AC3DImporter::CanRead(AC3DImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  uint32_t token;
  string local_48;
  undefined4 local_24;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  bVar1 = true;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar2 != 0) {
        if (local_48._M_string_length == 0 || checkSig) {
          local_24 = 0x41433344;
          bVar1 = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_24,1,0,4);
        }
        else {
          bVar1 = false;
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool AC3DImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    std::string extension = GetExtension(pFile);

    // fixme: are acc and ac3d *really* used? Some sources say they are
    if(extension == "ac" || extension == "ac3d" || extension == "acc") {
        return true;
    }
    if (!extension.length() || checkSig) {
        uint32_t token = AI_MAKE_MAGIC("AC3D");
        return CheckMagicToken(pIOHandler,pFile,&token,1,0);
    }
    return false;
}